

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  N_Vector p_Var11;
  N_Vector p_Var12;
  long lVar13;
  SUNLinearSolver S;
  long lVar14;
  char *__s;
  double tol;
  SUNContext sunctx;
  UserData ProbData;
  undefined8 local_68;
  long local_60;
  long local_58;
  N_Vector local_50;
  long local_48;
  N_Vector local_40;
  N_Vector local_38;
  
  iVar1 = SUNContext_Create(0,&local_68);
  if (iVar1 != 0) {
    puts("ERROR: SUNContext_Create failed");
    return -1;
  }
  if (argc < 5) {
    puts("ERROR: FOUR (4) Inputs required:");
    puts("  Problem size should be >0");
    puts("  Maximum Krylov subspace dimension should be >0");
    puts("  Solver tolerance should be >0");
    __s = "  timing output flag should be 0 or 1 ";
  }
  else {
    problem_size = atol(argv[1]);
    local_60 = problem_size;
    if (problem_size < 1) {
      __s = "ERROR: Problem size must be a positive integer";
    }
    else {
      uVar2 = atoi(argv[2]);
      if ((int)uVar2 < 1) {
        __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
      }
      else {
        tol = atof(argv[3]);
        if (0.0 < tol) {
          uVar3 = atoi(argv[4]);
          SetTiming(uVar3);
          puts("\nPCG linear solver test:");
          printf("  Problem size = %ld\n",local_60);
          printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar2);
          printf("  Solver Tolerance = %g\n",tol);
          printf("  timing output flag = %i\n\n",(ulong)uVar3);
          p_Var11 = (N_Vector)N_VNew_Serial(local_60,local_68);
          if (p_Var11 == (N_Vector)0x0) {
            main_cold_5();
            return 1;
          }
          local_48 = N_VNew_Serial(local_60,local_68);
          if (local_48 == 0) {
            main_cold_4();
            return 1;
          }
          p_Var12 = (N_Vector)N_VNew_Serial(local_60,local_68);
          if (p_Var12 == (N_Vector)0x0) {
            main_cold_3();
            return 1;
          }
          local_58 = N_VNew_Serial(local_60,local_68);
          if (local_58 != 0) {
            local_50 = (N_Vector)N_VNew_Serial(local_60,local_68);
            if (local_50 == (N_Vector)0x0) {
              main_cold_1();
              return 1;
            }
            local_40 = p_Var12;
            lVar13 = N_VGetArrayPointer(local_48);
            if (0 < local_60) {
              lVar14 = 0;
              do {
                iVar1 = rand();
                *(double *)(lVar13 + lVar14 * 8) = (double)iVar1 / 2147483647.0 + 1.0;
                lVar14 = lVar14 + 1;
              } while (lVar14 < local_60);
            }
            N_VConst(0x4014000000000000,local_58);
            local_38 = p_Var11;
            S = (SUNLinearSolver)SUNLinSol_PCG(p_Var11,2,uVar2);
            iVar1 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_ITERATIVE,0);
            iVar4 = Test_SUNLinSolGetID(S,SUNLINEARSOLVER_PCG,0);
            iVar5 = Test_SUNLinSolSetATimes(S,&local_60,ATimes,0);
            iVar6 = Test_SUNLinSolSetPreconditioner(S,&local_60,PSetup,PSolve,0);
            iVar7 = Test_SUNLinSolSetScalingVectors(S,local_50,(N_Vector)0x0,0);
            iVar8 = Test_SUNLinSolSetZeroGuess(S,0);
            iVar9 = Test_SUNLinSolInitialize(S,0);
            iVar10 = Test_SUNLinSolSpace(S,0);
            uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
            if (uVar2 == 0) {
              puts("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n");
              N_VConst(0x3ff0000000000000,local_50);
              p_Var12 = local_38;
              N_VProd(local_48,local_50,local_38);
              p_Var11 = local_40;
              uVar2 = ATimes(&local_60,p_Var12,local_40);
              if (uVar2 != 0) {
                fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",(ulong)uVar2);
                return 1;
              }
              iVar1 = SUNLinSol_PCGSetPrecType(S);
              iVar4 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              iVar5 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,1,0);
              iVar6 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,0,0);
              iVar7 = Test_SUNLinSolLastFlag(S,0);
              iVar8 = Test_SUNLinSolNumIters(S,0);
              iVar9 = Test_SUNLinSolResNorm(S,0);
              iVar10 = Test_SUNLinSolResid(S,0);
              uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
              if (uVar2 == 0) {
                puts("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n",(ulong)uVar2);
              }
              uVar3 = (uint)(uVar2 != 0);
              N_VConst(0x3ff0000000000000,local_50);
              N_VProd(local_48,local_50,p_Var12);
              p_Var11 = local_40;
              uVar2 = ATimes(&local_60,p_Var12,local_40);
              if (uVar2 == 0) {
                iVar1 = SUNLinSol_PCGSetPrecType(S);
                iVar4 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
                iVar5 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,1,0);
                iVar6 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,0,0);
                iVar7 = Test_SUNLinSolLastFlag(S,0);
                iVar8 = Test_SUNLinSolNumIters(S,0);
                iVar9 = Test_SUNLinSolResNorm(S,0);
                iVar10 = Test_SUNLinSolResid(S,0);
                uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                if (uVar2 == 0) {
                  puts("SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n",(ulong)uVar2);
                  uVar3 = uVar3 + 1;
                }
                lVar13 = N_VGetArrayPointer(local_50);
                p_Var11 = local_40;
                if (0 < local_60) {
                  lVar14 = 0;
                  do {
                    iVar1 = rand();
                    *(double *)(lVar13 + lVar14 * 8) = ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0
                    ;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < local_60);
                }
                N_VProd(local_48,local_50,p_Var12);
                uVar2 = ATimes(&local_60,p_Var12,p_Var11);
                if (uVar2 == 0) {
                  iVar1 = SUNLinSol_PCGSetPrecType(S);
                  iVar4 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
                  iVar5 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,1,0);
                  iVar6 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,0,0);
                  iVar7 = Test_SUNLinSolLastFlag(S,0);
                  iVar8 = Test_SUNLinSolNumIters(S,0);
                  iVar9 = Test_SUNLinSolResNorm(S,0);
                  iVar10 = Test_SUNLinSolResid(S,0);
                  uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                  if (uVar2 == 0) {
                    puts("SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n");
                  }
                  else {
                    printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n",(ulong)uVar2
                          );
                    uVar3 = uVar3 + 1;
                  }
                  lVar13 = N_VGetArrayPointer(local_50);
                  p_Var11 = local_40;
                  if (0 < local_60) {
                    lVar14 = 0;
                    do {
                      iVar1 = rand();
                      *(double *)(lVar13 + lVar14 * 8) =
                           ((double)iVar1 / 2147483647.0) * 1000.0 + 1.0;
                      lVar14 = lVar14 + 1;
                    } while (lVar14 < local_60);
                  }
                  N_VProd(local_48,local_50,p_Var12);
                  uVar2 = ATimes(&local_60,p_Var12,p_Var11);
                  if (uVar2 == 0) {
                    iVar1 = SUNLinSol_PCGSetPrecType(S);
                    iVar4 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
                    iVar5 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,1,0);
                    iVar6 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,p_Var12,p_Var11,tol,0,0);
                    iVar7 = Test_SUNLinSolLastFlag(S,0);
                    iVar8 = Test_SUNLinSolNumIters(S,0);
                    iVar9 = Test_SUNLinSolResNorm(S,0);
                    iVar10 = Test_SUNLinSolResid(S,0);
                    uVar2 = iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar1;
                    if (uVar2 == 0) {
                      puts("SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n");
                    }
                    else {
                      printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n",
                             (ulong)uVar2);
                      uVar3 = uVar3 + 1;
                    }
                    SUNLinSolFree(S);
                    N_VDestroy(p_Var12);
                    N_VDestroy(local_48);
                    N_VDestroy(local_40);
                    N_VDestroy(local_58);
                    N_VDestroy(local_50);
                    SUNContext_Free(&local_68);
                    return uVar3;
                  }
                }
              }
              fprintf(_stderr,"\nERROR: %s() failed with flag = %d\n\n","ATimes",(ulong)uVar2);
              return 1;
            }
            printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",(ulong)uVar2);
            return 1;
          }
          main_cold_2();
          return 1;
        }
        __s = "ERROR: Solver tolerance must be a positive real number";
      }
    }
  }
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  maxl = atoi(argv[2]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[3]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nPCG linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create PCG linear solver */
  LS = SUNLinSol_PCG(x, SUN_PREC_RIGHT, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_PCG, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s, NULL, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run test with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaling (no preconditioning) ***/

  /* set scaling vector */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaling (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s);
  SUNContext_Free(&sunctx);

  return (passfail);
}